

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astPragmaNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  ulong uVar2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  anon_struct_72_9_6444e132 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_b8;
  sysbvm_tuple_t sStack_b0;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  ulong local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_stackFrameRecord_t local_70;
  undefined8 local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_b8 = 0;
  sStack_b0 = 0;
  local_78 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 9;
  local_40 = (undefined1 *)&local_b8;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_b8 = sysbvm_context_shallowCopy(context,*arguments);
  sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_b8 + 0x18) = sVar4;
  local_70.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_70.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_60 = *(undefined8 *)(local_b8 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_70);
  sStack_b0 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_b8 + 0x28),(context->roots).symbolType,
                         arguments[1]);
  _Var3 = sysbvm_astNode_isLiteralNode(context,sStack_b0);
  uVar7 = *(ulong *)(local_b8 + 0x30);
  if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
    local_98 = sysbvm_array_create(context,0);
  }
  else {
    uVar1 = *(uint *)(uVar7 + 0xc);
    sVar4 = (sysbvm_tuple_t)(uVar1 >> 3);
    local_98 = sysbvm_array_create(context,sVar4);
    bVar8 = uVar1 < 8;
    if (!bVar8) {
      uVar7 = 0;
      do {
        uVar2 = *(ulong *)(local_b8 + 0x30);
        if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
          local_a8 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar7 * 8);
        }
        else {
          local_a8 = 0;
        }
        sStack_a0 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                              (context,local_a8,0,arguments[1]);
        bVar9 = _Var3 != false;
        _Var3 = false;
        if (bVar9) {
          _Var3 = sysbvm_astNode_isLiteralNode(context,sStack_a0);
        }
        if ((local_98 & 0xf) == 0 && local_98 != 0) {
          *(sysbvm_tuple_t *)(local_98 + 0x10 + uVar7 * 8) = sStack_a0;
        }
        uVar7 = uVar7 + 1;
      } while (sVar4 != uVar7);
      goto LAB_0011820a;
    }
  }
  sVar4 = 0;
  bVar8 = true;
LAB_0011820a:
  if (_Var3 == false) {
    *(sysbvm_tuple_t *)(local_b8 + 0x30) = local_98;
    *(sysbvm_tuple_t *)(local_b8 + 0x20) = (context->roots).pragmaType;
    sysbvm_stackFrame_popRecord(&local_70);
    sysbvm_stackFrame_popRecord(&local_58);
    local_78 = local_b8;
  }
  else {
    sStack_90 = sysbvm_astLiteralNode_getValue(sStack_b0);
    local_88 = sysbvm_array_create(context,sVar4);
    if (!bVar8) {
      sVar6 = 0;
      do {
        uVar7 = local_88;
        if ((local_98 & 0xf) == 0 && local_98 != 0) {
          sVar5 = *(sysbvm_tuple_t *)(local_98 + 0x10 + sVar6 * 8);
        }
        else {
          sVar5 = 0;
        }
        sVar5 = sysbvm_astLiteralNode_getValue(sVar5);
        if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
          *(sysbvm_tuple_t *)(uVar7 + 0x10 + sVar6 * 8) = sVar5;
        }
        sVar6 = sVar6 + 1;
      } while (sVar4 != sVar6);
    }
    sStack_80 = sysbvm_pragma_create(context,sStack_90,local_88);
    local_78 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_b8 + 0x10),sStack_80);
    sysbvm_analysisEnvironment_addPragma(context,arguments[1],sStack_80);
    sysbvm_stackFrame_popRecord(&local_70);
    sysbvm_stackFrame_popRecord(&local_58);
  }
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_astPragmaNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astPragmaNode_t *pragmaNode;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t literalPragmaSelector;
        sysbvm_tuple_t literalPragmaArguments;
        sysbvm_tuple_t literalPragma;
        sysbvm_tuple_t literalPragmaNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.pragmaNode = (sysbvm_astPragmaNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.pragmaNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.pragmaNode->super.sourcePosition);

    gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.pragmaNode->selector, context->roots.symbolType, *environment);
    bool isLiteral = sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedSelector);

    size_t pragmaArgumentCount = sysbvm_array_getSize(gcFrame.pragmaNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, pragmaArgumentCount);
    for(size_t i = 0; i < pragmaArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.pragmaNode->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        isLiteral = isLiteral && sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedArgument);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    if(isLiteral)
    {
        gcFrame.literalPragmaSelector = sysbvm_astLiteralNode_getValue(gcFrame.analyzedSelector);
        gcFrame.literalPragmaArguments = sysbvm_array_create(context, pragmaArgumentCount);
        for(size_t i = 0; i < pragmaArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.literalPragmaArguments, i, sysbvm_astLiteralNode_getValue(sysbvm_array_at(gcFrame.analyzedArguments, i)));
        
        gcFrame.literalPragma = sysbvm_pragma_create(context, gcFrame.literalPragmaSelector, gcFrame.literalPragmaArguments);
        gcFrame.literalPragmaNode = sysbvm_astLiteralNode_create(context, gcFrame.pragmaNode->super.sourcePosition, gcFrame.literalPragma);
        sysbvm_analysisEnvironment_addPragma(context, *environment, gcFrame.literalPragma);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)gcFrame.literalPragmaNode;
    }

    gcFrame.pragmaNode->arguments = gcFrame.analyzedArguments;
    gcFrame.pragmaNode->super.analyzedType = context->roots.pragmaType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.pragmaNode;
}